

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O0

void __thiscall IR::LabelInstr::LabelInstr(LabelInstr *this,JitArenaAllocator *allocator)

{
  JitArenaAllocator *allocator_local;
  LabelInstr *this_local;
  
  Instr::Instr(&this->super_Instr,false);
  (this->super_Instr)._vptr_Instr = (_func_int **)&PTR_Dump_01dd9c28;
  SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator>::SListCounted
            (&this->labelRefs,&allocator->super_ArenaAllocator);
  this->field_0x78 = this->field_0x78 & 0xfe;
  this->field_0x78 = this->field_0x78 & 0xfd;
  this->field_0x78 = this->field_0x78 & 0xfb;
  this->field_0x78 = this->field_0x78 & 0xf7;
  this->field_0x78 = this->field_0x78 & 0xef;
  this->field_0x78 = this->field_0x78 & 0xdf;
  this->m_loweredBasicBlock = (LoweredBasicBlock *)0x0;
  this->m_name = (char16 *)0x0;
  this->m_block = (BasicBlock *)0x0;
  this->m_region = (Region *)0x0;
  this->m_id = 0;
  (this->m_pc).pc = (BYTE *)0x0;
  return;
}

Assistant:

LabelInstr(JitArenaAllocator * allocator) : Instr(), labelRefs(allocator), m_isLoopTop(false), m_block(nullptr), isOpHelper(false),
        m_hasNonBranchRef(false), m_region(nullptr), m_loweredBasicBlock(nullptr), m_isDataLabel(false), m_isForInExit(false)
#if DBG
        , m_noHelperAssert(false)
        , m_name(nullptr)
#endif
    {
#if DBG_DUMP
        m_id = 0;
#endif
        m_pc.pc = nullptr;
    }